

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t lzx_read_bitlen(lzx_stream *strm,huffman *d,wchar_t end)

{
  lzx_br *br;
  ushort uVar1;
  lzx_dec *plVar2;
  htree_t *phVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  wchar_t wVar10;
  htree_t *phVar11;
  uchar *puVar12;
  wchar_t wVar13;
  ulong uVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  bool bVar17;
  
  plVar2 = strm->ds;
  wVar15 = plVar2->loop;
  if (wVar15 == L'\0') {
    d->freq[0xc] = L'\0';
    d->freq[0xd] = L'\0';
    d->freq[0xe] = L'\0';
    d->freq[0xf] = L'\0';
    d->freq[8] = L'\0';
    d->freq[9] = L'\0';
    d->freq[10] = L'\0';
    d->freq[0xb] = L'\0';
    d->freq[4] = L'\0';
    d->freq[5] = L'\0';
    d->freq[6] = L'\0';
    d->freq[7] = L'\0';
    d->freq[0] = L'\0';
    d->freq[1] = L'\0';
    d->freq[2] = L'\0';
    d->freq[3] = L'\0';
    d->freq[0x10] = L'\0';
  }
  if (end < L'\0') {
    end = d->len_size;
  }
  wVar5 = L'\x01';
  if (wVar15 < end) {
    br = &plVar2->br;
    do {
      plVar2->loop = wVar15;
      wVar5 = (plVar2->br).cache_avail;
      wVar16 = (plVar2->pt).max_bits;
      if (wVar5 < wVar16) {
        wVar4 = lzx_br_fillup(strm,br);
        wVar5 = (plVar2->br).cache_avail;
        wVar16 = (plVar2->pt).max_bits;
        if (wVar4 != L'\0' || wVar16 <= wVar5) goto LAB_00124ffe;
LAB_001253b5:
        wVar5 = L'\0';
        goto LAB_001253b7;
      }
LAB_00124ffe:
      uVar8 = (uint)((plVar2->br).cache_buffer >> ((char)wVar5 - (char)wVar16 & 0x3fU)) &
              cache_masks[wVar16];
      wVar4 = (plVar2->pt).shift_bits;
      uVar1 = (plVar2->pt).tbl[uVar8 >> ((byte)wVar4 & 0x1f)];
      wVar10 = (wchar_t)uVar1;
      wVar13 = (plVar2->pt).len_size;
      if (wVar13 <= (int)(uint)uVar1) {
        phVar3 = (plVar2->pt).tree;
        do {
          uVar14 = 0;
          if ((wVar4 < L'\x01') || (wVar10 = wVar10 - wVar13, (plVar2->pt).tree_used <= wVar10))
          goto LAB_001250d4;
          wVar4 = wVar4 + L'\xffffffff';
          phVar11 = (htree_t *)&phVar3[wVar10].right;
          if ((uVar8 >> (wVar4 & 0x1fU) & 1) != 0) {
            phVar11 = phVar3 + wVar10;
          }
          wVar10 = (wchar_t)phVar11->left;
        } while (wVar13 <= wVar10);
      }
      if (wVar10 == L'\x13') {
        puVar12 = (plVar2->pt).bitlen;
        uVar8 = (uint)puVar12[0x13];
        if (wVar5 < wVar16 + (uint)puVar12[0x13] + L'\x01') {
          wVar5 = lzx_br_fillup(strm,br);
          puVar12 = (plVar2->pt).bitlen;
          if (wVar5 == L'\0') {
            wVar5 = (plVar2->br).cache_avail;
            uVar8 = (uint)puVar12[0x13];
            if (wVar5 < (plVar2->pt).max_bits + (uint)puVar12[0x13] + L'\x01') goto LAB_001253b5;
          }
          else {
            uVar8 = (uint)puVar12[0x13];
            wVar5 = (plVar2->br).cache_avail;
          }
        }
        (plVar2->br).cache_avail = wVar5 - uVar8;
        uVar14 = (plVar2->br).cache_buffer;
        wVar5 = (wVar5 - uVar8) + L'\xffffffff';
        bVar17 = (uVar14 >> ((ulong)(uint)wVar5 & 0x3f) & 1) != 0;
        if (end < (uint)bVar17 + wVar15 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar5;
        wVar16 = (plVar2->pt).max_bits;
        uVar8 = (uint)(uVar14 >> ((char)wVar5 - (char)wVar16 & 0x3fU)) & cache_masks[wVar16];
        wVar16 = (plVar2->pt).shift_bits;
        wVar4 = (plVar2->pt).len_size;
        uVar1 = (plVar2->pt).tbl[uVar8 >> ((byte)wVar16 & 0x1f)];
        if ((int)(uint)uVar1 < wVar4) {
          uVar9 = (uint)uVar1;
        }
        else {
          phVar3 = (plVar2->pt).tree;
          do {
            uVar9 = 0;
            if ((wVar16 < L'\x01') ||
               (wVar13 = (uint)uVar1 - wVar4, (plVar2->pt).tree_used <= wVar13)) break;
            wVar16 = wVar16 + L'\xffffffff';
            phVar11 = (htree_t *)&phVar3[wVar13].right;
            if ((uVar8 >> (wVar16 & 0x1fU) & 1) != 0) {
              phVar11 = phVar3 + wVar13;
            }
            uVar1 = phVar11->left;
            uVar9 = (uint)uVar1;
          } while (wVar4 <= (int)(uint)uVar1);
        }
        (plVar2->br).cache_avail = wVar5 - (uint)puVar12[uVar9];
        lVar6 = (long)wVar15;
        uVar8 = (int)((d->bitlen[lVar6] - uVar9) + 0x11) % 0x11;
        if ((int)uVar8 < 0) {
          return L'\xffffffff';
        }
        uVar9 = (uint)bVar17;
        iVar7 = 0;
        do {
          d->bitlen[lVar6] = (uchar)uVar8;
          lVar6 = lVar6 + 1;
          iVar7 = iVar7 + -1;
        } while (-4 - uVar9 != iVar7);
        wVar15 = wVar15 - iVar7;
        d->freq[uVar8] = d->freq[uVar8] + (uVar9 | 4);
      }
      else if (wVar10 == L'\x12') {
        uVar8 = (uint)(plVar2->pt).bitlen[0x12];
        if (wVar5 < uVar8 + L'\x05') {
          wVar5 = lzx_br_fillup(strm,br);
          puVar12 = (plVar2->pt).bitlen;
          if (wVar5 == L'\0') {
            wVar5 = (plVar2->br).cache_avail;
            uVar8 = (uint)puVar12[0x12];
            if (wVar5 < uVar8 + L'\x05') goto LAB_001253b5;
          }
          else {
            uVar8 = (uint)puVar12[0x12];
            wVar5 = (plVar2->br).cache_avail;
          }
        }
        (plVar2->br).cache_avail = wVar5 - uVar8;
        wVar5 = (wVar5 - uVar8) + L'\xfffffffb';
        uVar8 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar5 & 0x3f)) & 0x1f;
        wVar16 = uVar8 + wVar15 + L'\x14';
        if (end < wVar16) {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar5;
        memset(d->bitlen + wVar15,0,(ulong)(uVar8 + 0x14));
        wVar15 = wVar16;
      }
      else {
        uVar14 = (ulong)(uint)wVar10;
        if (wVar10 == L'\x11') {
          uVar8 = (uint)(plVar2->pt).bitlen[0x11];
          if (wVar5 < uVar8 + L'\x04') {
            wVar5 = lzx_br_fillup(strm,br);
            puVar12 = (plVar2->pt).bitlen;
            if (wVar5 == L'\0') {
              wVar5 = (plVar2->br).cache_avail;
              uVar8 = (uint)puVar12[0x11];
              if (wVar5 < uVar8 + L'\x04') goto LAB_001253b5;
            }
            else {
              uVar8 = (uint)puVar12[0x11];
              wVar5 = (plVar2->br).cache_avail;
            }
          }
          (plVar2->br).cache_avail = wVar5 - uVar8;
          wVar5 = (wVar5 - uVar8) + L'\xfffffffc';
          uVar8 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar5 & 0x3f)) & 0xf;
          if (end < uVar8 + wVar15 + L'\x04') {
            return L'\xffffffff';
          }
          (plVar2->br).cache_avail = wVar5;
          lVar6 = (long)wVar15;
          iVar7 = 0;
          do {
            d->bitlen[lVar6] = '\0';
            lVar6 = lVar6 + 1;
            iVar7 = iVar7 + -1;
          } while (-4 - uVar8 != iVar7);
          wVar15 = wVar15 - iVar7;
        }
        else {
LAB_001250d4:
          (plVar2->br).cache_avail = wVar5 - (uint)(plVar2->pt).bitlen[uVar14];
          puVar12 = d->bitlen;
          uVar8 = (int)(((uint)puVar12[wVar15] - (int)uVar14) + 0x11) % 0x11;
          if ((int)uVar8 < 0) {
            return L'\xffffffff';
          }
          d->freq[uVar8] = d->freq[uVar8] + L'\x01';
          puVar12[wVar15] = (uchar)uVar8;
          wVar15 = wVar15 + L'\x01';
        }
      }
    } while (wVar15 < end);
    wVar5 = L'\x01';
  }
LAB_001253b7:
  plVar2->loop = wVar15;
  return wVar5;
}

Assistant:

static int
lzx_read_bitlen(struct lzx_stream *strm, struct huffman *d, int end)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int c, i, j, ret, same;
	unsigned rbits;

	i = ds->loop;
	if (i == 0)
		memset(d->freq, 0, sizeof(d->freq));
	ret = 0;
	if (end < 0)
		end = d->len_size;
	while (i < end) {
		ds->loop = i;
		if (!lzx_br_read_ahead(strm, br, ds->pt.max_bits))
			goto getdata;
		rbits = lzx_br_bits(br, ds->pt.max_bits);
		c = lzx_decode_huffman(&(ds->pt), rbits);
		switch (c) {
		case 17:/* several zero lengths, from 4 to 19. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+4))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 4) + 4;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 4);
			for (j = 0; j < same; j++)
				d->bitlen[i++] = 0;
			break;
		case 18:/* many zero lengths, from 20 to 51. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+5))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 5) + 20;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 5);
			memset(d->bitlen + i, 0, same);
			i += same;
			break;
		case 19:/* a few same lengths. */
			if (!lzx_br_read_ahead(strm, br,
			    ds->pt.bitlen[c]+1+ds->pt.max_bits))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 1) + 4;
			if (i + same > end)
				return (-1);
			lzx_br_consume(br, 1);
			rbits = lzx_br_bits(br, ds->pt.max_bits);
			c = lzx_decode_huffman(&(ds->pt), rbits);
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			for (j = 0; j < same; j++)
				d->bitlen[i++] = c;
			d->freq[c] += same;
			break;
		default:
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			d->freq[c]++;
			d->bitlen[i++] = c;
			break;
		}
	}
	ret = 1;
getdata:
	ds->loop = i;
	return (ret);
}